

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PCacheBufferSetup(void *pBuf,int sz,int n)

{
  undefined4 local_1c;
  PgFreeslot *p;
  int n_local;
  int sz_local;
  void *pBuf_local;
  
  if (pcache1_g.isInit != 0) {
    n_local = n;
    sz_local = sz;
    if (pBuf == (void *)0x0) {
      n_local = 0;
      sz_local = 0;
    }
    if (n_local == 0) {
      sz_local = 0;
    }
    pcache1_g.nFreeSlot = n_local;
    pcache1_g.nSlot = n_local;
    if (n_local < 0x5b) {
      local_1c = n_local / 10 + 1;
    }
    else {
      local_1c = 10;
    }
    pcache1_g.nReserve = local_1c;
    pcache1_g.pFree = (PgFreeslot *)0x0;
    pcache1_g.bUnderPressure = 0;
    pcache1_g.szSlot = sz_local & 0xfffffff8U;
    pcache1_g.pStart = pBuf;
    pBuf_local = pBuf;
    while (n_local != 0) {
      *(PgFreeslot **)pBuf_local = pcache1_g.pFree;
      pcache1_g.pFree = (PgFreeslot *)pBuf_local;
      pBuf_local = (void *)((long)pBuf_local + (long)(int)(sz_local & 0xfffffff8U));
      n_local = n_local + -1;
    }
    pcache1_g.pEnd = pBuf_local;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PCacheBufferSetup(void *pBuf, int sz, int n){
  if( pcache1.isInit ){
    PgFreeslot *p;
    if( pBuf==0 ) sz = n = 0;
    if( n==0 ) sz = 0;
    sz = ROUNDDOWN8(sz);
    pcache1.szSlot = sz;
    pcache1.nSlot = pcache1.nFreeSlot = n;
    pcache1.nReserve = n>90 ? 10 : (n/10 + 1);
    pcache1.pStart = pBuf;
    pcache1.pFree = 0;
    pcache1.bUnderPressure = 0;
    while( n-- ){
      p = (PgFreeslot*)pBuf;
      p->pNext = pcache1.pFree;
      pcache1.pFree = p;
      pBuf = (void*)&((char*)pBuf)[sz];
    }
    pcache1.pEnd = pBuf;
  }
}